

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall
QMenuPrivate::activateCausedStack
          (QMenuPrivate *this,QList<QPointer<QWidget>_> *causedStack,QAction *action,
          ActionEvent action_e,bool self)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QMenu *pQVar4;
  QMenuBar *pQVar5;
  int in_ECX;
  ActionEvent in_EDX;
  QList<QPointer<QWidget>_> *in_RSI;
  QMenuPrivate *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  QMenuBar *qmenubar;
  QMenu *qmenu;
  int i;
  bool activationRecursionGuardReset;
  QMenu *q;
  QPointer<QWidget> widget;
  QPointer<QMenu> guard;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_widgets_qmenu_cpp:1414:36)>
  boolBlocker;
  anon_class_16_2_3dd763a3_for_m_func *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int local_84;
  int local_80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  in_RDI->activationRecursionGuard = true;
  QPointer<QMenu>::QPointer<void>
            ((QPointer<QMenu> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (QMenu *)in_stack_ffffffffffffff48);
  local_80 = in_stack_ffffffffffffff54;
  if ((in_R8B & 1) != 0) {
    QAction::activate(in_EDX);
    local_80 = in_stack_ffffffffffffff54;
  }
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x645601);
  if (bVar2) {
    qScopeGuard<QMenuPrivate::activateCausedStack(QList<QPointer<QWidget>>const&,QAction*,QAction::ActionEvent,bool)::__0>
              (in_stack_ffffffffffffff48);
    for (local_84 = 0; qVar3 = QList<QPointer<QWidget>_>::size(in_RSI), local_84 < qVar3;
        local_84 = local_84 + 1) {
      QList<QPointer<QWidget>_>::at
                ((QList<QPointer<QWidget>_> *)CONCAT44(local_80,in_stack_ffffffffffffff50),
                 (qsizetype)in_stack_ffffffffffffff48);
      QPointer<QWidget>::QPointer
                ((QPointer<QWidget> *)CONCAT44(local_80,in_stack_ffffffffffffff50),
                 (QPointer<QWidget> *)in_stack_ffffffffffffff48);
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x6456d9);
      if (bVar2) {
        ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x6456f4);
        pQVar4 = qobject_cast<QMenu*>((QObject *)0x6456fc);
        if (pQVar4 == (QMenu *)0x0) {
          ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x645763);
          pQVar5 = qobject_cast<QMenuBar*>((QObject *)0x64576b);
          if (pQVar5 != (QMenuBar *)0x0) {
            if (in_ECX == 0) {
              QMenuBar::triggered((QMenuBar *)0x64578e,(QAction *)in_stack_ffffffffffffff48);
            }
            else if (in_ECX == 1) {
              QMenuBar::hovered((QMenuBar *)0x6457a6,(QAction *)in_stack_ffffffffffffff48);
            }
            local_80 = 2;
            goto LAB_006457bc;
          }
        }
        else {
          QMenu::d_func((QMenu *)0x645713);
          QPointer<QWidget>::operator=
                    ((QPointer<QWidget> *)CONCAT44(local_80,in_stack_ffffffffffffff50),
                     (QPointer<QWidget> *)in_stack_ffffffffffffff48);
          if (in_ECX == 0) {
            QMenu::triggered((QMenu *)0x64573d,(QAction *)in_stack_ffffffffffffff48);
          }
          else if (in_ECX == 1) {
            QMenu::hovered((QMenu *)0x645755,(QAction *)in_stack_ffffffffffffff48);
          }
        }
        local_80 = 0;
      }
      else {
        local_80 = 4;
      }
LAB_006457bc:
      QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x6457c6);
      if ((local_80 != 0) && (local_80 == 2)) break;
    }
    QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qmenu.cpp:1414:36)>
    ::~QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_widgets_qmenu_cpp:1414:36)>
                    *)CONCAT44(local_80,in_stack_ffffffffffffff50));
  }
  QPointer<QMenu>::~QPointer((QPointer<QMenu> *)0x645812);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::activateCausedStack(const QList<QPointer<QWidget>> &causedStack, QAction *action,
                                       QAction::ActionEvent action_e, bool self)
{
    Q_Q(QMenu);
    // can't use QScopedValueRollback here
    const bool activationRecursionGuardReset = activationRecursionGuard;
    activationRecursionGuard = true;
    QPointer<QMenu> guard(q);
    if (self)
        action->activate(action_e);
    if (!guard)
        return;
    auto boolBlocker = qScopeGuard([this, activationRecursionGuardReset]{
        activationRecursionGuard = activationRecursionGuardReset;
    });

    for(int i = 0; i < causedStack.size(); ++i) {
        QPointer<QWidget> widget = causedStack.at(i);
        if (!widget)
            continue;
        //fire
        if (QMenu *qmenu = qobject_cast<QMenu*>(widget)) {
            widget = qmenu->d_func()->causedPopup.widget;
            if (action_e == QAction::Trigger) {
                emit qmenu->triggered(action);
           } else if (action_e == QAction::Hover) {
                emit qmenu->hovered(action);
            }
#if QT_CONFIG(menubar)
        } else if (QMenuBar *qmenubar = qobject_cast<QMenuBar*>(widget)) {
            if (action_e == QAction::Trigger) {
                emit qmenubar->triggered(action);
            } else if (action_e == QAction::Hover) {
                emit qmenubar->hovered(action);
            }
            break; //nothing more..
#endif
        }
    }
}